

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreqFlucCorrFunc.cpp
# Opt level: O3

int __thiscall
OpenMD::FreqFlucCorrFunc::computeProperty1(FreqFlucCorrFunc *this,int frame,StuntDouble *sd)

{
  vector<double,std::allocator<double>> *this_00;
  iterator __position;
  bool bVar1;
  uint i;
  long lVar2;
  double *pdVar3;
  pointer pvVar4;
  double tmp;
  Vector3d u;
  RealType uedot;
  double local_a8 [4];
  double local_88 [4];
  RotMat3x3d local_68;
  
  lVar2 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).electricField.
                           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
  local_88[2] = *(double *)(lVar2 + 0x10 + (long)sd->localIndex_ * 0x18);
  pdVar3 = (double *)(lVar2 + (long)sd->localIndex_ * 0x18);
  local_88[0] = *pdVar3;
  local_88[1] = pdVar3[1];
  local_a8[0] = 0.0;
  local_a8[1] = 0.0;
  local_a8[2] = 0.0;
  if (sd->objType_ == otRigidBody) {
    StuntDouble::getA(&local_68,sd);
    local_a8[2] = local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2]
                  [2];
  }
  else {
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         (double)sd[1]._vptr_StuntDouble;
    bVar1 = MultipoleAdapter::isDipole((MultipoleAdapter *)&local_68);
    if (!bVar1) goto LAB_001356ad;
    lVar2 = *(long *)((long)&(sd->snapshotMan_->currentSnapshot_->atomData).dipole.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd->storage_);
    local_a8[2] = *(double *)(lVar2 + 0x10 + (long)sd->localIndex_ * 0x18);
    pdVar3 = (double *)(lVar2 + (long)sd->localIndex_ * 0x18);
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0] = *pdVar3;
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1] = pdVar3[1];
  }
  local_a8[0] = local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][0];
  local_a8[1] = local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[2][1];
LAB_001356ad:
  local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] = 0.0;
  lVar2 = 0;
  do {
    local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] =
         local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0] +
         local_a8[lVar2] * local_88[lVar2];
    lVar2 = lVar2 + 1;
  } while (lVar2 != 3);
  Utils::Accumulator<double>::add(&this->ueStats_,(double *)&local_68);
  pvVar4 = (this->ue_).
           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  this_00 = (vector<double,std::allocator<double>> *)(pvVar4 + frame);
  __position._M_current = *(double **)(this_00 + 8);
  if (__position._M_current == *(double **)(this_00 + 0x10)) {
    std::vector<double,std::allocator<double>>::_M_realloc_insert<double_const&>
              (this_00,__position,(double *)&local_68);
    pvVar4 = (this->ue_).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pdVar3 = *(pointer *)
              ((long)&pvVar4[frame].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data + 8);
  }
  else {
    *__position._M_current =
         local_68.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0][0];
    pdVar3 = __position._M_current + 1;
    *(double **)(this_00 + 8) = pdVar3;
  }
  return (int)((ulong)((long)pdVar3 -
                      *(long *)&pvVar4[frame].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data) >> 3) + -1;
}

Assistant:

int FreqFlucCorrFunc::computeProperty1(int frame, StuntDouble* sd) {
    Vector3d e = sd->getElectricField();
    Vector3d u;
    if (sd->isRigidBody()) {
      u = sd->getA().getRow(2);
    } else {
      AtomType* at        = static_cast<Atom*>(sd)->getAtomType();
      MultipoleAdapter ma = MultipoleAdapter(at);

      if (ma.isDipole()) { u = sd->getDipole(); }
    }

    RealType uedot = dot(u, e);
    ueStats_.add(uedot);

    ue_[frame].push_back(uedot);
    return ue_[frame].size() - 1;
  }